

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O1

ui_event inkey_m(void)

{
  ui_event_type uVar1;
  ulong uVar3;
  undefined4 in_EDX;
  ulong uVar4;
  ui_event uVar5;
  mouseclick mVar2;
  
  mVar2.type = EVT_NONE;
  mVar2.x = '\0';
  mVar2.y = '\0';
  mVar2.button = '\0';
  mVar2.mods = '\0';
  uVar3 = 0;
  while ((uVar1 = mVar2.type, 1 < uVar1 - EVT_KBRD && (uVar1 != EVT_BUTTON))) {
    if (uVar1 == EVT_ESCAPE) {
      uVar3 = 0xe00000000001;
      in_EDX = 0;
      goto LAB_001ebb55;
    }
    uVar5 = inkey_ex();
    in_EDX = uVar5._8_4_;
    mVar2 = uVar5.mouse;
    uVar3 = (ulong)mVar2 & 0xffffffff00000000;
  }
  uVar4 = 1;
  if (uVar1 != EVT_BUTTON) {
    uVar4 = (ulong)mVar2 & 0xffffffff;
  }
  uVar3 = uVar3 | uVar4;
LAB_001ebb55:
  uVar5._8_4_ = in_EDX;
  uVar5._0_4_ = (int)uVar3;
  uVar5._4_1_ = (char)(uVar3 >> 0x20);
  uVar5._5_1_ = (char)(uVar3 >> 0x28);
  uVar5._6_1_ = (char)(uVar3 >> 0x30);
  uVar5._7_1_ = (char)(uVar3 >> 0x38);
  return uVar5;
}

Assistant:

ui_event inkey_m(void)
{
	ui_event ke = EVENT_EMPTY;

	/* Only accept a keypress */
	while (ke.type != EVT_ESCAPE && ke.type != EVT_KBRD	&&
		   ke.type != EVT_MOUSE  && ke.type != EVT_BUTTON)
		ke = inkey_ex();
	if (ke.type == EVT_ESCAPE) {
		ke.type = EVT_KBRD;
		ke.key.code = ESCAPE;
		ke.key.mods = 0;
	} else if (ke.type == EVT_BUTTON) {
		ke.type = EVT_KBRD;
	}

  return ke;
}